

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::ContextError::ContextError
          (ContextError *this,string *ctx,Type t,string *key,string *alt)

{
  string *in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  Type in_stack_0000000c;
  string *in_stack_ffffffffffffff88;
  Error *in_stack_ffffffffffffff90;
  string local_48 [40];
  string *local_20;
  undefined4 local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  format(in_stack_0000000c,unaff_retaddr,in_RDI,in_RSI);
  Error::Error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_48);
  *(undefined ***)in_RDI = &PTR__ContextError_0015d978;
  std::__cxx11::string::string((string *)(in_RDI->field_2)._M_local_buf,(string *)in_RSI);
  std::__cxx11::string::string((string *)in_RDI[1].field_2._M_local_buf,local_20);
  *(undefined4 *)&in_RDI[2].field_2 = local_14;
  return;
}

Assistant:

ContextError::ContextError(const std::string& ctx, Type t, const std::string& key, const std::string& alt)
	: Error(format(t, ctx, key, alt))
	, ctx_(ctx)
	, key_(key)
	, type_(t) {
}